

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_nurbssurface.cpp
# Opt level: O2

double __thiscall ON_NurbsSurface::ControlPolygonLength(ON_NurbsSurface *this,int dir)

{
  uint uVar1;
  int i;
  int iVar2;
  double *P;
  double length;
  double local_38;
  
  local_38 = 0.0;
  if (((((uint)dir < 2) && (1 < this->m_cv_count[0])) && (1 < this->m_cv_count[1])) &&
     (this->m_cv != (double *)0x0)) {
    local_38 = 0.0;
    for (iVar2 = 0; iVar2 < this->m_cv_count[1 - dir]; iVar2 = iVar2 + 1) {
      length = 0.0;
      uVar1 = this->m_cv_stride[dir == 0] * iVar2;
      P = this->m_cv + uVar1;
      if ((int)uVar1 < 0) {
        P = (double *)0x0;
      }
      if (this->m_cv == (double *)0x0) {
        P = (double *)0x0;
      }
      ON_GetPolylineLength
                (this->m_dim,this->m_is_rat != 0,this->m_cv_count[(uint)dir],
                 this->m_cv_stride[(uint)dir],P,&length);
      if (length <= local_38) {
        length = local_38;
      }
      local_38 = length;
    }
  }
  return local_38;
}

Assistant:

double ON_NurbsSurface::ControlPolygonLength( int dir ) const
{
  double max_length = 0.0;
  if ( dir >= 0 && dir <= 1 && m_cv_count[0] >= 2 && m_cv_count[1] >= 2 && m_cv != nullptr )
  {
    double length;
    const double* p;
    int i;
    for( i = 0; i < m_cv_count[1-dir]; i++ )
    {
      length = 0.0;
      p = (dir) ? CV(i,0) : CV(0,i);
      ON_GetPolylineLength( m_dim, m_is_rat, m_cv_count[dir], m_cv_stride[dir], p, &length );
      if ( length > max_length )
        max_length = length;
    }
  }

  return max_length;
}